

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O1

Var Js::JavascriptMath::Add_FullHelper
              (Var primLeft,Var primRight,ScriptContext *scriptContext,JavascriptNumber *result,
              bool leftIsDead)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  JavascriptString *pJVar6;
  JavascriptString *pstRight;
  Var pvVar7;
  Type TVar8;
  Type TVar9;
  double value;
  
  if (primLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00aaaccb;
    *puVar4 = 0;
  }
  if (((ulong)primLeft & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)primLeft & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00aaaccb;
    *puVar4 = 0;
  }
  TVar9 = TypeIds_FirstNumberType;
  if ((((ulong)primLeft & 0xffff000000000000) != 0x1000000000000) &&
     (TVar9 = TypeIds_Number, (ulong)primLeft >> 0x32 == 0)) {
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(primLeft);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00aaaccb;
      *puVar4 = 0;
    }
    TVar9 = ((pRVar5->type).ptr)->typeId;
    if ((0x57 < (int)TVar9) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_00aaaccb;
      *puVar4 = 0;
    }
  }
  if (primRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00aaaccb;
    *puVar4 = 0;
  }
  if (((ulong)primRight & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)primRight & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00aaaccb;
    *puVar4 = 0;
  }
  TVar8 = TypeIds_FirstNumberType;
  if ((((ulong)primRight & 0xffff000000000000) != 0x1000000000000) &&
     (TVar8 = TypeIds_Number, (ulong)primRight >> 0x32 == 0)) {
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(primRight);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00aaaccb;
      *puVar4 = 0;
    }
    TVar8 = ((pRVar5->type).ptr)->typeId;
    if ((0x57 < (int)TVar8) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_00aaaccb:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  if ((TVar9 == TypeIds_BigInt) || (TVar8 == TypeIds_BigInt)) {
    if (TVar8 != TVar9) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fff3,L"Add BigInt");
    }
    pvVar7 = JavascriptBigInt::Add(primLeft,primRight);
    return pvVar7;
  }
  if (TVar9 == TypeIds_String) {
    pJVar6 = UnsafeVarTo<Js::JavascriptString>(primLeft);
    if (TVar8 == TypeIds_String) {
      pstRight = UnsafeVarTo<Js::JavascriptString>(primRight);
    }
    else {
      pstRight = JavascriptConversion::ToString(primRight,scriptContext);
    }
  }
  else {
    if (TVar8 != TypeIds_String) {
      value = Add_Helper(primLeft,primRight,scriptContext);
      pvVar7 = JavascriptNumber::ToVarMaybeInPlace(value,scriptContext,result);
      return pvVar7;
    }
    pJVar6 = JavascriptConversion::ToString(primLeft,scriptContext);
    pstRight = UnsafeVarTo<Js::JavascriptString>(primRight);
  }
  if (!leftIsDead) {
    pJVar6 = JavascriptString::Concat(pJVar6,pstRight);
    return pJVar6;
  }
  pJVar6 = JavascriptString::ConcatDestructive(pJVar6,pstRight);
  return pJVar6;
}

Assistant:

Var JavascriptMath::Add_FullHelper(Var primLeft, Var primRight, ScriptContext* scriptContext, JavascriptNumber *result, bool leftIsDead)
        {
            TypeId typeLeft = JavascriptOperators::GetTypeId(primLeft);
            TypeId typeRight = JavascriptOperators::GetTypeId(primRight);
            if (typeLeft == TypeIds_BigInt || typeRight == TypeIds_BigInt)
            {
                if (typeRight != typeLeft)
                {
                    JavascriptError::ThrowTypeError(scriptContext, VBSERR_TypeMismatch, _u("Add BigInt"));
                }
                return JavascriptBigInt::Add(primLeft, primRight);
            }

            // If either side is a string, then the result is also a string
            if (typeLeft == TypeIds_String)
            {
                JavascriptString* stringLeft = UnsafeVarTo<JavascriptString>(primLeft);
                JavascriptString* stringRight = nullptr;

                if (typeRight == TypeIds_String)
                {
                    stringRight = UnsafeVarTo<JavascriptString>(primRight);
                }
                else
                {
                    stringRight = JavascriptConversion::ToString(primRight, scriptContext);
                }

                if(leftIsDead)
                {
                    return stringLeft->ConcatDestructive(stringRight);
                }
                return JavascriptString::Concat(stringLeft, stringRight);
            }

            if (typeRight == TypeIds_String)
            {
                JavascriptString* stringLeft = JavascriptConversion::ToString(primLeft, scriptContext);
                JavascriptString* stringRight = UnsafeVarTo<JavascriptString>(primRight);

                if(leftIsDead)
                {
                    return stringLeft->ConcatDestructive(stringRight);
                }
                return JavascriptString::Concat(stringLeft, stringRight);
            }

            double sum = Add_Helper(primLeft, primRight, scriptContext);
            return JavascriptNumber::ToVarMaybeInPlace(sum, scriptContext, result);
        }